

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstName(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)reader->node;
    }
    else {
      ns = (xmlNsPtr)reader->curnode;
    }
    switch(ns->type) {
    case XML_ELEMENT_NODE:
    case XML_ATTRIBUTE_NODE:
      if ((ns[1].prefix == (xmlChar *)0x0) || (*(long *)(ns[1].prefix + 0x18) == 0)) {
        reader_local = (xmlTextReaderPtr)ns->href;
      }
      else {
        reader_local = (xmlTextReaderPtr)
                       constQString(reader,*(xmlChar **)(ns[1].prefix + 0x18),ns->href);
      }
      break;
    case XML_TEXT_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,(xmlChar *)"#text");
      break;
    case XML_CDATA_SECTION_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,(xmlChar *)"#cdata-section");
      break;
    case XML_ENTITY_REF_NODE:
    case XML_ENTITY_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,ns->href);
      break;
    case XML_PI_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,ns->href);
      break;
    case XML_COMMENT_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,(xmlChar *)"#comment");
      break;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,(xmlChar *)"#document");
      break;
    case XML_DOCUMENT_TYPE_NODE:
    case XML_DTD_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,ns->href);
      break;
    case XML_DOCUMENT_FRAG_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,(xmlChar *)"#document-fragment");
      break;
    case XML_NOTATION_NODE:
      reader_local = (xmlTextReaderPtr)constString(reader,ns->href);
      break;
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      reader_local = (xmlTextReaderPtr)0x0;
      break;
    case XML_NAMESPACE_DECL:
      if (ns->prefix == (xmlChar *)0x0) {
        reader_local = (xmlTextReaderPtr)constString(reader,"xmlns");
      }
      else {
        reader_local = (xmlTextReaderPtr)constQString(reader,"xmlns",ns->prefix);
      }
      break;
    default:
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstName(xmlTextReaderPtr reader) {
    xmlNodePtr node;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if ((node->ns == NULL) ||
		(node->ns->prefix == NULL))
		return(node->name);
	    return(constQString(reader, node->ns->prefix, node->name));
        case XML_TEXT_NODE:
	    return(constString(reader, BAD_CAST "#text"));
        case XML_CDATA_SECTION_NODE:
	    return(constString(reader, BAD_CAST "#cdata-section"));
        case XML_ENTITY_NODE:
        case XML_ENTITY_REF_NODE:
	    return(constString(reader, node->name));
        case XML_PI_NODE:
	    return(constString(reader, node->name));
        case XML_COMMENT_NODE:
	    return(constString(reader, BAD_CAST "#comment"));
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return(constString(reader, BAD_CAST "#document"));
        case XML_DOCUMENT_FRAG_NODE:
	    return(constString(reader, BAD_CAST "#document-fragment"));
        case XML_NOTATION_NODE:
	    return(constString(reader, node->name));
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(constString(reader, node->name));
        case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) node;

	    if (ns->prefix == NULL)
		return(constString(reader, BAD_CAST "xmlns"));
	    return(constQString(reader, BAD_CAST "xmlns", ns->prefix));
	}

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(NULL);
    }
    return(NULL);
}